

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegExecSetErrString(xmlRegExecCtxtPtr exec,xmlChar *value)

{
  xmlChar *pxVar1;
  xmlChar *value_local;
  xmlRegExecCtxtPtr exec_local;
  
  if (exec->errString != (xmlChar *)0x0) {
    (*xmlFree)(exec->errString);
  }
  if (value == (xmlChar *)0x0) {
    exec->errString = (xmlChar *)0x0;
  }
  else {
    pxVar1 = xmlStrdup(value);
    exec->errString = pxVar1;
    if (exec->errString == (xmlChar *)0x0) {
      exec->status = -5;
      return -1;
    }
  }
  return 0;
}

Assistant:

static int
xmlRegExecSetErrString(xmlRegExecCtxtPtr exec, const xmlChar *value) {
    if (exec->errString != NULL)
        xmlFree(exec->errString);
    if (value == NULL) {
        exec->errString = NULL;
    } else {
        exec->errString = xmlStrdup(value);
        if (exec->errString == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
            return(-1);
        }
    }
    return(0);
}